

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_a79145::cmStringSorter::ApplyFilter
          (string *__return_storage_ptr__,cmStringSorter *this,string *argument)

{
  string *psVar1;
  string *extraout_RAX;
  long in_RCX;
  long lVar2;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,argument,(long)&(argument->_M_dataplus)._M_p + in_RCX)
  ;
  lVar2 = 0;
  do {
    psVar1 = *(string **)((long)this->filters + lVar2);
    if (psVar1 != (string *)0x0) {
      (*(code *)psVar1)((string *)local_50,__return_storage_ptr__);
      psVar1 = (string *)
               std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
        psVar1 = extraout_RAX;
      }
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  return psVar1;
}

Assistant:

std::string ApplyFilter(const std::string& argument)
  {
    std::string result = argument;
    for (auto filter : this->filters) {
      if (filter != nullptr) {
        result = filter(result);
      }
    }
    return result;
  }